

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint unfilterScanline(uchar *recon,uchar *scanline,uchar *precon,size_t bytewidth,uchar filterType,
                     size_t length)

{
  uchar uVar1;
  ulong uVar2;
  uchar uVar3;
  size_t local_48;
  size_t i;
  size_t length_local;
  uchar filterType_local;
  size_t bytewidth_local;
  uchar *precon_local;
  uchar *scanline_local;
  uchar *recon_local;
  
  switch(filterType) {
  case '\0':
    for (local_48 = 0; local_48 != length; local_48 = local_48 + 1) {
      recon[local_48] = scanline[local_48];
    }
    break;
  case '\x01':
    for (local_48 = 0; uVar2 = bytewidth, local_48 != bytewidth; local_48 = local_48 + 1) {
      recon[local_48] = scanline[local_48];
    }
    while (local_48 = uVar2, local_48 < length) {
      recon[local_48] = scanline[local_48] + recon[local_48 - bytewidth];
      uVar2 = local_48 + 1;
    }
    break;
  case '\x02':
    if (precon == (uchar *)0x0) {
      for (local_48 = 0; local_48 != length; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48];
      }
    }
    else {
      for (local_48 = 0; local_48 != length; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48] + precon[local_48];
      }
    }
    break;
  case '\x03':
    if (precon == (uchar *)0x0) {
      for (local_48 = 0; uVar2 = bytewidth, local_48 != bytewidth; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48];
      }
      while (local_48 = uVar2, local_48 < length) {
        recon[local_48] = scanline[local_48] + recon[local_48 - bytewidth] / 2;
        uVar2 = local_48 + 1;
      }
    }
    else {
      for (local_48 = 0; uVar2 = bytewidth, local_48 != bytewidth; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48] + precon[local_48] / 2;
      }
      while (local_48 = uVar2, local_48 < length) {
        recon[local_48] =
             scanline[local_48] +
             (char)((ulong)((uint)recon[local_48 - bytewidth] + (uint)precon[local_48]) / 2);
        uVar2 = local_48 + 1;
      }
    }
    break;
  case '\x04':
    if (precon == (uchar *)0x0) {
      for (local_48 = 0; uVar2 = bytewidth, local_48 != bytewidth; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48];
      }
      while (local_48 = uVar2, local_48 < length) {
        recon[local_48] = scanline[local_48] + recon[local_48 - bytewidth];
        uVar2 = local_48 + 1;
      }
    }
    else {
      for (local_48 = 0; uVar2 = bytewidth, local_48 != bytewidth; local_48 = local_48 + 1) {
        recon[local_48] = scanline[local_48] + precon[local_48];
      }
      while (local_48 = uVar2, local_48 < length) {
        uVar1 = scanline[local_48];
        uVar3 = paethPredictor((ushort)recon[local_48 - bytewidth],(ushort)precon[local_48],
                               (ushort)precon[local_48 - bytewidth]);
        recon[local_48] = uVar1 + uVar3;
        uVar2 = local_48 + 1;
      }
    }
    break;
  default:
    return 0x24;
  }
  return 0;
}

Assistant:

static unsigned unfilterScanline(unsigned char* recon, const unsigned char* scanline, const unsigned char* precon,
                                 size_t bytewidth, unsigned char filterType, size_t length)
{
  /*
  For PNG filter method 0
  unfilter a PNG image scanline by scanline. when the pixels are smaller than 1 byte,
  the filter works byte per byte (bytewidth = 1)
  precon is the previous unfiltered scanline, recon the result, scanline the current one
  the incoming scanlines do NOT include the filtertype byte, that one is given in the parameter filterType instead
  recon and scanline MAY be the same memory address! precon must be disjoint.
  */

  size_t i;
  switch(filterType)
  {
    case 0:
      for(i = 0; i != length; ++i) recon[i] = scanline[i];
      break;
    case 1:
      for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i];
      for(i = bytewidth; i < length; ++i) recon[i] = scanline[i] + recon[i - bytewidth];
      break;
    case 2:
      if(precon)
      {
        for(i = 0; i != length; ++i) recon[i] = scanline[i] + precon[i];
      }
      else
      {
        for(i = 0; i != length; ++i) recon[i] = scanline[i];
      }
      break;
    case 3:
      if(precon)
      {
        for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i] + precon[i] / 2;
        for(i = bytewidth; i < length; ++i) recon[i] = scanline[i] + ((recon[i - bytewidth] + precon[i]) / 2);
      }
      else
      {
        for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i];
        for(i = bytewidth; i < length; ++i) recon[i] = scanline[i] + recon[i - bytewidth] / 2;
      }
      break;
    case 4:
      if(precon)
      {
        for(i = 0; i != bytewidth; ++i)
        {
          recon[i] = (scanline[i] + precon[i]); /*paethPredictor(0, precon[i], 0) is always precon[i]*/
        }
        for(i = bytewidth; i < length; ++i)
        {
          recon[i] = (scanline[i] + paethPredictor(recon[i - bytewidth], precon[i], precon[i - bytewidth]));
        }
      }
      else
      {
        for(i = 0; i != bytewidth; ++i)
        {
          recon[i] = scanline[i];
        }
        for(i = bytewidth; i < length; ++i)
        {
          /*paethPredictor(recon[i - bytewidth], 0, 0) is always recon[i - bytewidth]*/
          recon[i] = (scanline[i] + recon[i - bytewidth]);
        }
      }
      break;
    default: return 36; /*error: unexisting filter type given*/
  }
  return 0;
}